

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynet.cc
# Opt level: O0

VariableIndex __thiscall
dynet::ComputationGraph::add_const_parameters(ComputationGraph *this,Parameter p)

{
  size_type sVar1;
  ParameterStorage *pPVar2;
  reference ppNVar3;
  vector<dynet::Node_*,_std::allocator<dynet::Node_*>_> *in_RDI;
  ConstParameterNode *new_node;
  VariableIndex new_node_index;
  VariableIndex *in_stack_00000058;
  ComputationGraph *in_stack_00000060;
  value_type *in_stack_ffffffffffffffa8;
  vector<dynet::Node_*,_std::allocator<dynet::Node_*>_> *in_stack_ffffffffffffffb0;
  Device *this_00;
  Parameter *in_stack_ffffffffffffffc8;
  ConstParameterNode *in_stack_ffffffffffffffd0;
  Parameter local_8;
  
  sVar1 = std::vector<dynet::Node_*,_std::allocator<dynet::Node_*>_>::size(in_RDI);
  operator_new(0x98);
  ConstParameterNode::ConstParameterNode(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  std::vector<dynet::Node_*,_std::allocator<dynet::Node_*>_>::push_back
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  pPVar2 = Parameter::get_storage(&local_8);
  this_00 = pPVar2->device;
  ppNVar3 = std::vector<dynet::Node_*,_std::allocator<dynet::Node_*>_>::back
                      ((vector<dynet::Node_*,_std::allocator<dynet::Node_*>_> *)this_00);
  (*ppNVar3)->device = this_00;
  set_dim_for_new_node(in_stack_00000060,in_stack_00000058);
  return (VariableIndex)sVar1;
}

Assistant:

VariableIndex ComputationGraph::add_const_parameters(Parameter p) {
  VariableIndex new_node_index(nodes.size());
  ConstParameterNode* new_node = new ConstParameterNode(p);
  nodes.push_back(new_node);
  nodes.back()->device = p.get_storage().device;
  set_dim_for_new_node(new_node_index);
  return new_node_index;
}